

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O0

pair<polyscope::Structure_*,_unsigned_long> polyscope::pick::evaluatePickQuery(int xPos,int yPos)

{
  undefined8 uVar1;
  vec3 vec;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  int in_ESI;
  uint in_EDI;
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [16];
  size_t globalInd;
  array<float,_4UL> result;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
  x;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
  *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  cat;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>_>
  *__range2;
  FrameBuffer *pickFramebuffer;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
  *in_stack_fffffffffffffe98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  *in_stack_fffffffffffffea0;
  array<float,_4UL> *this;
  undefined4 in_stack_fffffffffffffea8;
  value_type_conflict8 _x;
  undefined4 in_stack_fffffffffffffeac;
  value_type_conflict8 _y;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  *in_stack_fffffffffffffeb0;
  vec<3,_float,_(glm::qualifier)0> local_13c;
  uint64_t local_130;
  float local_124;
  float fVar9;
  float fVar10;
  int local_114;
  void *local_110 [7];
  long *local_d8;
  _Self local_d0;
  _Self local_c8;
  undefined1 *local_c0;
  undefined1 auStack_98 [48];
  _Self local_68;
  _Self local_60;
  undefined1 *local_58;
  int local_4c;
  void *local_48;
  undefined8 local_3c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_34;
  element_type *local_30;
  int local_24;
  void *local_20;
  int local_18;
  uint local_14;
  pair<polyscope::Structure_*,_unsigned_long> local_10;
  
  if (((((int)in_EDI < -1) || (view::bufferWidth <= (int)in_EDI)) || (in_ESI < -1)) ||
     (view::bufferHeight <= in_ESI)) {
    local_20 = (void *)0x0;
    local_24 = 0;
    std::pair<polyscope::Structure_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
              (&local_10,&local_20,&local_24);
  }
  else {
    local_18 = in_ESI;
    local_14 = in_EDI;
    local_30 = std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                           *)(render::engine + 0x1e));
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x58))(render::engine,7);
    (*local_30->_vptr_FrameBuffer[0xb])
              (local_30,(ulong)(uint)view::bufferWidth,(ulong)(uint)view::bufferHeight);
    (*local_30->_vptr_FrameBuffer[10])
              (local_30,0,0,(ulong)(uint)view::bufferWidth,(ulong)(uint)view::bufferHeight);
    auVar5 = ZEXT1664((undefined1  [16])0x0);
    auVar7 = ZEXT1664((undefined1  [16])0x0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_3c,0.0,0.0,0.0);
    (local_30->clearColor).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_3c;
    (local_30->clearColor).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_3c._4_4_;
    (local_30->clearColor).field_2 = local_34;
    uVar3 = (*local_30->_vptr_FrameBuffer[3])();
    if ((uVar3 & 1) == 0) {
      local_48 = (void *)0x0;
      local_4c = 0;
      std::pair<polyscope::Structure_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
                (&local_10,&local_48,&local_4c);
    }
    else {
      (*local_30->_vptr_FrameBuffer[4])();
      local_58 = polyscope::state::structures_abi_cxx11_;
      local_60._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>_>
                    *)in_stack_fffffffffffffe98);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>_>
                  *)in_stack_fffffffffffffe98);
      while( true ) {
        bVar2 = std::operator!=(&local_60,&local_68);
        auVar6 = auVar7._0_16_;
        auVar8 = auVar5._0_16_;
        if (!bVar2) break;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>
                     *)in_stack_fffffffffffffea0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
        ::pair(in_stack_fffffffffffffeb0,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        local_c0 = auStack_98;
        local_c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
                      *)in_stack_fffffffffffffe98);
        local_d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
                    *)in_stack_fffffffffffffe98);
        while( true ) {
          bVar2 = std::operator!=(&local_c8,&local_d0);
          if (!bVar2) break;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>
                       *)0x363c18);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
                  *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          auVar8 = (**(code **)(*local_d8 + 0x18))();
          auVar7._0_8_ = auVar8._8_8_;
          auVar5._0_8_ = auVar8._0_8_;
          auVar7._8_56_ = extraout_var_00;
          auVar5._8_56_ = extraout_var;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
                   *)0x363c44);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>
                        *)in_stack_fffffffffffffea0);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
        ::~pair(in_stack_fffffffffffffea0);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>_>
                      *)in_stack_fffffffffffffea0);
      }
      if ((local_14 == 0xffffffff) || (local_18 == -1)) {
        local_110[0] = (void *)0x0;
        local_114 = 0;
        std::pair<polyscope::Structure_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
                  (&local_10,local_110,&local_114);
      }
      else {
        (*local_30->_vptr_FrameBuffer[0xc])
                  (local_30,(ulong)local_14,(ulong)(uint)(view::bufferHeight - local_18));
        uVar1 = vmovlpd_avx(auVar8);
        local_124 = (float)uVar1;
        fVar9 = (float)((ulong)uVar1 >> 0x20);
        uVar1 = vmovlpd_avx(auVar6);
        fVar10 = (float)uVar1;
        this = (array<float,_4UL> *)&local_124;
        pvVar4 = std::array<float,_4UL>::operator[](this,(size_type)in_stack_fffffffffffffe98);
        _x = *pvVar4;
        pvVar4 = std::array<float,_4UL>::operator[](this,(size_type)in_stack_fffffffffffffe98);
        _y = *pvVar4;
        pvVar4 = std::array<float,_4UL>::operator[](this,(size_type)in_stack_fffffffffffffe98);
        glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_13c,_x,_y,*pvVar4);
        vec.field_2 = local_13c.field_2;
        vec.field_0 = local_13c.field_0;
        vec.field_1 = local_13c.field_1;
        local_130 = vecToInd(vec);
        local_10 = globalIndexToLocal(CONCAT44(fVar10,fVar9));
      }
    }
  }
  return local_10;
}

Assistant:

std::pair<Structure*, size_t> evaluatePickQuery(int xPos, int yPos) {

  // NOTE: hack used for debugging: if xPos == yPos == 1 we do a pick render but do not query the value.

  // Be sure not to pick outside of buffer
  if (xPos < -1 || xPos >= view::bufferWidth || yPos < -1 || yPos >= view::bufferHeight) {
    return {nullptr, 0};
  }

  render::FrameBuffer* pickFramebuffer = render::engine->pickFramebuffer.get();

  render::engine->setDepthMode();
  render::engine->setBlendMode(BlendMode::Disable);

  pickFramebuffer->resize(view::bufferWidth, view::bufferHeight);
  pickFramebuffer->setViewport(0, 0, view::bufferWidth, view::bufferHeight);
  pickFramebuffer->clearColor = glm::vec3{0., 0., 0.};
  if (!pickFramebuffer->bindForRendering()) return {nullptr, 0};
  pickFramebuffer->clear();

  // Render pick buffer
  for (auto cat : state::structures) {
    for (auto x : cat.second) {
      x.second->drawPick();
    }
  }

  if (xPos == -1 || yPos == -1) {
    return {nullptr, 0};
  }

  // Read from the pick buffer
  std::array<float, 4> result = pickFramebuffer->readFloat4(xPos, view::bufferHeight - yPos);
  size_t globalInd = pick::vecToInd(glm::vec3{result[0], result[1], result[2]});

  return pick::globalIndexToLocal(globalInd);
}